

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int eventSetFunc(uint event,eventFunc_t f)

{
  FILE *pFVar1;
  int iVar2;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: event=%d function=%08X\n",myTimeStamp::buf,"eventSetFunc",event,
            (ulong)f & 0xffffffff);
  }
  pFVar1 = _stderr;
  if (libInitialised == '\0') {
    iVar2 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
              "eventSetFunc");
    }
  }
  else if (event < 0x20) {
    iVar2 = 0;
    intEventSetFunc(event,f,0,(void *)0x0);
  }
  else {
    iVar2 = -0x8f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      fprintf(pFVar1,"%s %s: bad event (%d)\n",myTimeStamp::buf,"eventSetFunc",event);
    }
  }
  return iVar2;
}

Assistant:

int eventSetFunc(unsigned event, eventFunc_t f)
{
   DBG(DBG_USER, "event=%d function=%08X", event, (uint32_t)f);

   CHECK_INITED;

   if (event > PI_MAX_EVENT)
      SOFT_ERROR(PI_BAD_EVENT_ID, "bad event (%d)", event);

   intEventSetFunc(event, f, 0, NULL);

   return 0;
}